

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  undefined1 local_60 [8];
  ScopedElement e;
  allocator<char> local_29;
  
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + -1;
  if (1 < iVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e.m_fmt,"OverallResults",&local_29);
    XmlWriter::scopedElement((XmlWriter *)local_60,(string *)&this->m_xml,(int)&e + 8);
    std::__cxx11::string::~string((string *)&e.m_fmt);
    std::__cxx11::string::string<std::allocator<char>>((string *)&e.m_fmt,"successes",&local_29);
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_60,(string *)&e.m_fmt,&(sectionStats->assertions).passed);
    std::__cxx11::string::~string((string *)&e.m_fmt);
    std::__cxx11::string::string<std::allocator<char>>((string *)&e.m_fmt,"failures",&local_29);
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_60,(string *)&e.m_fmt,&(sectionStats->assertions).failed);
    std::__cxx11::string::~string((string *)&e.m_fmt);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e.m_fmt,"expectedFailures",&local_29);
    XmlWriter::writeAttribute<unsigned_long>
              ((XmlWriter *)local_60,(string *)&e.m_fmt,&(sectionStats->assertions).failedButOk);
    std::__cxx11::string::~string((string *)&e.m_fmt);
    iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e.m_fmt,"durationInSeconds",&local_29);
      XmlWriter::writeAttribute<double>
                ((XmlWriter *)local_60,(string *)&e.m_fmt,&sectionStats->durationInSeconds);
      std::__cxx11::string::~string((string *)&e.m_fmt);
    }
    XmlWriter::endElement(&this->m_xml,Newline|Indent);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_60);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded(SectionStats const& sectionStats) {
        StreamingReporterBase::sectionEnded(sectionStats);
        if (--m_sectionDepth > 0) {
            XmlWriter::ScopedElement e = m_xml.scopedElement("OverallResults");
            e.writeAttribute("successes", sectionStats.assertions.passed);
            e.writeAttribute("failures", sectionStats.assertions.failed);
            e.writeAttribute("expectedFailures", sectionStats.assertions.failedButOk);

            if (m_config->showDurations() == ShowDurations::Always)
                e.writeAttribute("durationInSeconds", sectionStats.durationInSeconds);

            m_xml.endElement();
        }
    }